

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(char lhs,SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_ESI;
  undefined1 in_DIL;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  
  uVar3 = CONCAT13(in_DIL,in_stack_fffffffffffffff4);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_4);
  bVar1 = ModulusSimpleCaseHelper<unsigned_int,_signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase((char)((uint)uVar3 >> 0x18),in_ESI,&local_4);
  if (!bVar1) {
    SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffee,&stack0xfffffffffffffff7);
    SafeInt::operator_cast_to_unsigned_int
              ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(uVar3,in_ESI.m_int));
    SVar2 = SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                      ((SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *
                       )CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),0);
    SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(uVar3,in_ESI.m_int),
               (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(SVar2.m_int,in_stack_ffffffffffffffe8));
  }
  return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_4.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}